

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

ssize_t __thiscall
Omega_h::HostWrite<long>::write(HostWrite<long> *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  ScopedTimer local_19;
  Write<int> *pWStack_18;
  ScopedTimer timer;
  HostWrite<long> *this_local;
  
  pWStack_18 = (Write<int> *)CONCAT44(in_register_00000034,__fd);
  ScopedTimer::ScopedTimer(&local_19,"array host to device",(char *)0x0);
  Write<long>::Write(&this->write_,(Write<int> *)CONCAT44(in_register_00000034,__fd));
  ScopedTimer::~ScopedTimer(&local_19);
  return (ssize_t)this;
}

Assistant:

Write<T> HostWrite<T>::write() const {
  ScopedTimer timer("array host to device");
#ifdef OMEGA_H_USE_KOKKOS
  Kokkos::deep_copy(write_.view(), mirror_);
#elif defined(OMEGA_H_USE_CUDA)
  auto const err = cudaMemcpy(write_.data(), mirror_.get(),
      std::size_t(size()) * sizeof(T), cudaMemcpyHostToDevice);
  OMEGA_H_CHECK(err == cudaSuccess);
#endif
  return write_;
}